

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectoringNozzleSystem.h
# Opt level: O0

VectoringNozzleSystem * __thiscall
DIS::VectoringNozzleSystem::operator=(VectoringNozzleSystem *this,VectoringNozzleSystem *param_1)

{
  float fVar1;
  VectoringNozzleSystem *param_1_local;
  VectoringNozzleSystem *this_local;
  
  fVar1 = param_1->_verticalDeflectionAngle;
  this->_horizontalDeflectionAngle = param_1->_horizontalDeflectionAngle;
  this->_verticalDeflectionAngle = fVar1;
  return this;
}

Assistant:

class OPENDIS7_EXPORT VectoringNozzleSystem
{
protected:
  /** In degrees */
  float _horizontalDeflectionAngle; 

  /** In degrees */
  float _verticalDeflectionAngle; 


 public:
    VectoringNozzleSystem();
    virtual ~VectoringNozzleSystem();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getHorizontalDeflectionAngle() const; 
    void setHorizontalDeflectionAngle(float pX); 

    float getVerticalDeflectionAngle() const; 
    void setVerticalDeflectionAngle(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const VectoringNozzleSystem& rhs) const;
}